

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t run_arm_filter(rar5 *rar,filter_info *flt)

{
  uint32_t uVar1;
  uint8_t *b;
  long lStack_20;
  uint32_t offset;
  ssize_t i;
  filter_info *flt_local;
  rar5 *rar_local;
  
  circular_memcpy((rar->cstate).filtered_buf,(rar->cstate).window_buf,(rar->cstate).window_mask,
                  (rar->cstate).solid_offset + flt->block_start,
                  (rar->cstate).solid_offset + flt->block_start + flt->block_length);
  for (lStack_20 = 0; lStack_20 < flt->block_length + -3; lStack_20 = lStack_20 + 4) {
    if ((rar->cstate).window_buf
        [(rar->cstate).solid_offset + flt->block_start + lStack_20 + 3U & (rar->cstate).window_mask]
        == 0xeb) {
      uVar1 = read_filter_data(rar,(int)(rar->cstate).solid_offset + (int)flt->block_start +
                                   (uint32_t)lStack_20 & (uint)(rar->cstate).window_mask);
      write_filter_data(rar,(uint32_t)lStack_20,
                        (uVar1 & 0xffffff) - (int)((lStack_20 + flt->block_start) / 4) & 0xffffff |
                        0xeb000000);
    }
  }
  return L'\0';
}

Assistant:

static int run_arm_filter(struct rar5* rar, struct filter_info* flt) {
	ssize_t i = 0;
	uint32_t offset;

	circular_memcpy(rar->cstate.filtered_buf,
	    rar->cstate.window_buf, rar->cstate.window_mask,
	    rar->cstate.solid_offset + flt->block_start,
	    rar->cstate.solid_offset + flt->block_start + flt->block_length);

	for(i = 0; i < flt->block_length - 3; i += 4) {
		uint8_t* b = &rar->cstate.window_buf[
		    (rar->cstate.solid_offset +
		    flt->block_start + i + 3) & rar->cstate.window_mask];

		if(*b == 0xEB) {
			/* 0xEB = ARM's BL (branch + link) instruction. */
			offset = read_filter_data(rar,
			    (rar->cstate.solid_offset + flt->block_start + i) &
			     (uint32_t)rar->cstate.window_mask) & 0x00ffffff;

			offset -= (uint32_t) ((i + flt->block_start) / 4);
			offset = (offset & 0x00ffffff) | 0xeb000000;
			write_filter_data(rar, (uint32_t)i, offset);
		}
	}

	return ARCHIVE_OK;
}